

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O3

Fl_Type * __thiscall Fl_Tabs_Type::click_test(Fl_Tabs_Type *this,int x,int y)

{
  Fl_Tabs *this_00;
  Fl_Widget *pFVar1;
  Fl_Widget *pFVar2;
  Fl_Type *pFVar3;
  Fl_Tabs *__stat_loc;
  
  this_00 = (Fl_Tabs *)(this->super_Fl_Group_Type).super_Fl_Widget_Type.o;
  pFVar1 = Fl_Tabs::which(this_00,x,y);
  if (pFVar1 == (Fl_Widget *)0x0) {
    pFVar3 = (Fl_Type *)0x0;
  }
  else {
    pFVar2 = Fl_Tabs::value(this_00);
    (*(this_00->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3])(this_00,1);
    __stat_loc = this_00;
    Fl::pushed((Fl_Widget *)this_00);
    while ((Fl_Tabs *)Fl::pushed_ == this_00) {
      Fl::wait(__stat_loc);
    }
    if (pFVar1 != pFVar2) {
      set_modflag(1);
    }
    pFVar1 = Fl_Tabs::value(this_00);
    pFVar3 = (Fl_Type *)pFVar1->user_data_;
  }
  return pFVar3;
}

Assistant:

Fl_Type* Fl_Tabs_Type::click_test(int x, int y) {
  Fl_Tabs *t = (Fl_Tabs*)o;
  Fl_Widget *a = t->which(x,y);
  if (!a) return 0; // didn't click on tab
  // changing the visible tab has an impact on the generated
  // source code, so mark this project as changed.
  int changed = (a!=t->value());
  // okay, run the tabs ui until they let go of mouse:
  t->handle(FL_PUSH);
  Fl::pushed(t);
  while (Fl::pushed()==t) Fl::wait();
  if (changed) set_modflag(1);
  return (Fl_Type*)(t->value()->user_data());
}